

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O2

void __thiscall
irr::scene::SViewFrustum::setFrom(SViewFrustum *this,matrix4 *mat,bool zClipFromZero)

{
  undefined3 in_register_00000011;
  vector3d<float> *this_00;
  long lVar1;
  bool bVar2;
  float fVar3;
  
  this->planes[2].Normal.X = mat->M[3] + mat->M[0];
  this->planes[2].Normal.Y = mat->M[7] + mat->M[4];
  this->planes[2].Normal.Z = mat->M[0xb] + mat->M[8];
  this->planes[2].D = mat->M[0xf] + mat->M[0xc];
  this->planes[3].Normal.X = mat->M[3] - mat->M[0];
  this->planes[3].Normal.Y = mat->M[7] - mat->M[4];
  this->planes[3].Normal.Z = mat->M[0xb] - mat->M[8];
  this->planes[3].D = mat->M[0xf] - mat->M[0xc];
  this->planes[5].Normal.X = mat->M[3] - mat->M[1];
  this->planes[5].Normal.Y = mat->M[7] - mat->M[5];
  this->planes[5].Normal.Z = mat->M[0xb] - mat->M[9];
  this->planes[5].D = mat->M[0xf] - mat->M[0xd];
  this->planes[4].Normal.X = mat->M[3] + mat->M[1];
  this->planes[4].Normal.Y = mat->M[7] + mat->M[5];
  this->planes[4].Normal.Z = mat->M[0xb] + mat->M[9];
  this->planes[4].D = mat->M[0xf] + mat->M[0xd];
  this->planes[0].Normal.X = mat->M[3] - mat->M[2];
  this->planes[0].Normal.Y = mat->M[7] - mat->M[6];
  this->planes[0].Normal.Z = mat->M[0xb] - mat->M[10];
  this->planes[0].D = mat->M[0xf] - mat->M[0xe];
  if (CONCAT31(in_register_00000011,zClipFromZero) == 0) {
    this->planes[1].Normal.X = mat->M[3] + mat->M[2];
    this->planes[1].Normal.Y = mat->M[7] + mat->M[6];
    this->planes[1].Normal.Z = mat->M[0xb] + mat->M[10];
    fVar3 = mat->M[0xf] + mat->M[0xe];
  }
  else {
    this->planes[1].Normal.X = mat->M[2];
    this->planes[1].Normal.Y = mat->M[6];
    this->planes[1].Normal.Z = mat->M[10];
    fVar3 = mat->M[0xe];
  }
  this_00 = &this->planes[0].Normal;
  this->planes[1].D = fVar3;
  lVar1 = 6;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    fVar3 = -1.0 / SQRT(this_00->Z * this_00->Z + this_00->X * this_00->X + this_00->Y * this_00->Y)
    ;
    core::vector3d<float>::operator*=(this_00,fVar3);
    this_00[1].X = fVar3 * this_00[1].X;
    this_00 = (vector3d<float> *)&this_00[1].Y;
  }
  recalculateBoundingBox(this);
  return;
}

Assistant:

inline void SViewFrustum::setFrom(const core::matrix4 &mat, bool zClipFromZero)
{
	// left clipping plane
	planes[VF_LEFT_PLANE].Normal.X = mat[3] + mat[0];
	planes[VF_LEFT_PLANE].Normal.Y = mat[7] + mat[4];
	planes[VF_LEFT_PLANE].Normal.Z = mat[11] + mat[8];
	planes[VF_LEFT_PLANE].D = mat[15] + mat[12];

	// right clipping plane
	planes[VF_RIGHT_PLANE].Normal.X = mat[3] - mat[0];
	planes[VF_RIGHT_PLANE].Normal.Y = mat[7] - mat[4];
	planes[VF_RIGHT_PLANE].Normal.Z = mat[11] - mat[8];
	planes[VF_RIGHT_PLANE].D = mat[15] - mat[12];

	// top clipping plane
	planes[VF_TOP_PLANE].Normal.X = mat[3] - mat[1];
	planes[VF_TOP_PLANE].Normal.Y = mat[7] - mat[5];
	planes[VF_TOP_PLANE].Normal.Z = mat[11] - mat[9];
	planes[VF_TOP_PLANE].D = mat[15] - mat[13];

	// bottom clipping plane
	planes[VF_BOTTOM_PLANE].Normal.X = mat[3] + mat[1];
	planes[VF_BOTTOM_PLANE].Normal.Y = mat[7] + mat[5];
	planes[VF_BOTTOM_PLANE].Normal.Z = mat[11] + mat[9];
	planes[VF_BOTTOM_PLANE].D = mat[15] + mat[13];

	// far clipping plane
	planes[VF_FAR_PLANE].Normal.X = mat[3] - mat[2];
	planes[VF_FAR_PLANE].Normal.Y = mat[7] - mat[6];
	planes[VF_FAR_PLANE].Normal.Z = mat[11] - mat[10];
	planes[VF_FAR_PLANE].D = mat[15] - mat[14];

	// near clipping plane
	if (zClipFromZero) {
		planes[VF_NEAR_PLANE].Normal.X = mat[2];
		planes[VF_NEAR_PLANE].Normal.Y = mat[6];
		planes[VF_NEAR_PLANE].Normal.Z = mat[10];
		planes[VF_NEAR_PLANE].D = mat[14];
	} else {
		// near clipping plane
		planes[VF_NEAR_PLANE].Normal.X = mat[3] + mat[2];
		planes[VF_NEAR_PLANE].Normal.Y = mat[7] + mat[6];
		planes[VF_NEAR_PLANE].Normal.Z = mat[11] + mat[10];
		planes[VF_NEAR_PLANE].D = mat[15] + mat[14];
	}

	// normalize normals
	u32 i;
	for (i = 0; i != VF_PLANE_COUNT; ++i) {
		const f32 len = -core::reciprocal_squareroot(
				planes[i].Normal.getLengthSQ());
		planes[i].Normal *= len;
		planes[i].D *= len;
	}

	// make bounding box
	recalculateBoundingBox();
}